

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVA.cpp
# Opt level: O0

void __thiscall MT32Emu::TVA::startDecay(TVA *this)

{
  Bit8u local_11;
  Bit8u newIncrement;
  TVA *this_local;
  
  if (this->phase < 6) {
    if ((this->partialParam->tva).envTime[4] == '\0') {
      local_11 = '\x01';
    }
    else {
      local_11 = -(this->partialParam->tva).envTime[4];
    }
    startRamp(this,'\0',local_11,6);
  }
  return;
}

Assistant:

void TVA::startDecay() {
	if (phase >= TVA_PHASE_RELEASE) {
		return;
	}
	Bit8u newIncrement;
	if (partialParam->tva.envTime[4] == 0) {
		newIncrement = 1;
	} else {
		newIncrement = -partialParam->tva.envTime[4];
	}
	// The next time nextPhase() is called, it will think TVA_PHASE_RELEASE has finished and the partial will be aborted
	startRamp(0, newIncrement, TVA_PHASE_RELEASE);
}